

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clmul_5bytes.cpp
# Opt level: O2

Sketch * ConstructClMul5Bytes(int bits,int implementation)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (Sketch *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

Sketch* ConstructClMul5Bytes(int bits, int implementation) {
    switch (bits) {
#ifdef ENABLE_FIELD_INT_33
    case 33: return new SketchImpl<Field33>(implementation, 33);
#endif
#ifdef ENABLE_FIELD_INT_34
    case 34: return new SketchImpl<Field34>(implementation, 34);
#endif
#ifdef ENABLE_FIELD_INT_35
    case 35: return new SketchImpl<Field35>(implementation, 35);
#endif
#ifdef ENABLE_FIELD_INT_36
    case 36: return new SketchImpl<Field36>(implementation, 36);
#endif
#ifdef ENABLE_FIELD_INT_37
    case 37: return new SketchImpl<Field37>(implementation, 37);
#endif
#ifdef ENABLE_FIELD_INT_38
    case 38: return new SketchImpl<Field38>(implementation, 38);
#endif
#ifdef ENABLE_FIELD_INT_39
    case 39: return new SketchImpl<Field39>(implementation, 39);
#endif
#ifdef ENABLE_FIELD_INT_40
    case 40: return new SketchImpl<Field40>(implementation, 40);
#endif
    }
    return nullptr;
}